

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.h
# Opt level: O0

void __thiscall embree::Averaged<double>::add(Averaged<double> *this,double v)

{
  _Map_pointer pppVar1;
  deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *in_RDI;
  deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *unaff_retaddr;
  value_type *in_stack_ffffffffffffffc8;
  deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *__new_size;
  
  __new_size = in_RDI;
  getSeconds();
  std::make_pair<double,double&>((double *)in_RDI,&in_stack_ffffffffffffffc8->first);
  std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_front
            (in_RDI,in_stack_ffffffffffffffc8);
  pppVar1 = (_Map_pointer)
            std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                      ((deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        *)0x16e3d8);
  if (in_RDI[1].
      super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Deque_impl_data._M_map < pppVar1) {
    std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::resize
              (unaff_retaddr,(size_type)__new_size);
  }
  return;
}

Assistant:

void add(double v)
    {
      values.push_front(std::make_pair(getSeconds(),v));
      if (values.size() > N) values.resize(N);
    }